

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTrimmedCurve::IfcTrimmedCurve(IfcTrimmedCurve *this)

{
  *(undefined ***)&this->field_0xc8 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xd0 = 0;
  *(char **)&this->field_0xd8 = "IfcTrimmedCurve";
  IfcBoundedCurve::IfcBoundedCurve
            (&this->super_IfcBoundedCurve,&PTR_construction_vtable_24__00765398);
  *(undefined8 *)&(this->super_IfcBoundedCurve).field_0x48 = 0;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7652b8;
  *(undefined8 *)&this->field_0xc8 = 0x765380;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7652e0;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x765308;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       0x765330;
  *(undefined8 *)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = 0x765358;
  *(undefined8 *)&(this->super_IfcBoundedCurve).field_0x50 = 0;
  (this->Trim1).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Trim1).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Trim1).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Trim2).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Trim2).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Trim2).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SenseAgreement)._M_dataplus._M_p = (pointer)&(this->SenseAgreement).field_2;
  (this->SenseAgreement)._M_string_length = 0;
  (this->SenseAgreement).field_2._M_local_buf[0] = '\0';
  (this->MasterRepresentation)._M_dataplus._M_p = (pointer)&(this->MasterRepresentation).field_2;
  (this->MasterRepresentation)._M_string_length = 0;
  (this->MasterRepresentation).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcTrimmedCurve() : Object("IfcTrimmedCurve") {}